

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O1

void __thiscall cab_session::cab_session(cab_session *this,application *application,socket *socket)

{
  socket *this_00;
  undefined8 *puVar1;
  ostream *poVar2;
  address local_90;
  string local_70;
  data_union local_50;
  endpoint_type local_34;
  
  (this->super_enable_shared_from_this<cab_session>)._M_weak_this.
  super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<cab_session>)._M_weak_this.
  super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_application = application;
  this_00 = &this->_socket;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)this_00,
                   (io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)socket);
  *(undefined8 *)((long)&(this->_handle_buffer).super__Function_base._M_functor + 8) = 0;
  (this->_handle_buffer).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->_handle_buffer).super__Function_base._M_functor = 0;
  (this->_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_handle_buffer)._M_invoker = (_Invoker_type)0x0;
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = handle_join;
  puVar1[1] = 0;
  puVar1[2] = this;
  *(undefined8 **)&(this->_handle_buffer).super__Function_base._M_functor = puVar1;
  (this->_handle_buffer)._M_invoker =
       std::_Function_handler<void_(),_std::_Bind<void_(cab_session::*(cab_session_*))()>_>::
       _M_invoke;
  (this->_handle_buffer).super__Function_base._M_manager =
       std::_Function_handler<void_(),_std::_Bind<void_(cab_session::*(cab_session_*))()>_>::
       _M_manager;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cab connection from ",0x14);
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::remote_endpoint((endpoint_type *)&local_50.base,
                    &this_00->
                     super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   );
  if (local_50.base.sa_family == 2) {
    local_90._0_8_ = (ulong)local_50.v6.sin6_flowinfo << 0x20;
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
    local_90.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_90.ipv6_address_.scope_id_ = 0;
  }
  else {
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_50.base.sa_data[6];
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_50.base.sa_data[7];
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_50.base.sa_data[8];
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_50.base.sa_data[9];
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_50.base.sa_data[10];
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_50.base.sa_data[0xb];
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_50.base.sa_data[0xc];
    local_90.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_50.base.sa_data[0xd];
    local_90.ipv6_address_.addr_.__in6_u._8_8_ = local_50._16_8_;
    local_90.ipv6_address_.scope_id_ = (unsigned_long)local_50.v6.sin6_scope_id;
    local_90.type_ = ipv6;
    local_90.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  }
  boost::asio::ip::address::to_string_abi_cxx11_(&local_70,&local_90);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::remote_endpoint(&local_34,
                    &this_00->
                     super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   );
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," opened\n",8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cab_session::cab_session(application& application, boost::asio::ip::tcp::socket&& socket):
    _application(&application),
    _socket(std::move(socket))
{
    std::cout << "Cab connection from " << this->_socket.remote_endpoint().address().to_string()
              << ":" << this->_socket.remote_endpoint().port() << " opened\n";
}